

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckd_alloc.c
# Opt level: O2

void ckd_free_3d(void *inptr)

{
  void *__ptr;
  
  if (inptr != (void *)0x0) {
    if (*inptr == (undefined8 *)0x0) {
      __ptr = (void *)0x0;
    }
    else {
      free((void *)**inptr);
      __ptr = *inptr;
    }
    free(__ptr);
  }
  free(inptr);
  return;
}

Assistant:

void
ckd_free_3d(void *inptr)
{
    void ***ptr = (void ***)inptr;

    if (ptr && ptr[0])
        ckd_free(ptr[0][0]);
    if (ptr)
        ckd_free(ptr[0]);
    ckd_free(ptr);
}